

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateVkImpl::InitializePipeline
          (PipelineStateVkImpl *this,ComputePipelineStateCreateInfo *CreateInfo)

{
  IPipelineStateCache *pSrcPtr;
  VkPipelineCache cache;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  vkShaderStages;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ShaderModules;
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  local_e8;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  local_c8;
  TShaderStages local_a8;
  PipelineWrapper local_90;
  VkComputePipelineCreateInfo local_78;
  
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitInternalObjects<Diligent::ComputePipelineStateCreateInfo>
            (&local_a8,this,CreateInfo,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)&local_e8,&local_c8);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&local_a8);
  pSrcPtr = (CreateInfo->super_PipelineStateCreateInfo).pPSOCache;
  if (pSrcPtr == (IPipelineStateCache *)0x0) {
    cache = (VkPipelineCache)0x0;
  }
  else {
    CheckDynamicType<Diligent::PipelineStateCacheVkImpl,Diligent::IPipelineStateCache>(pSrcPtr);
    cache = (VkPipelineCache)pSrcPtr[9].super_IDeviceObject.super_IObject._vptr_IObject;
  }
  local_78.pNext = (void *)0x0;
  local_78.basePipelineHandle = (VkPipeline)0x0;
  local_78.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_78._4_4_ = 0;
  local_78.flags = 1;
  local_78._20_4_ = 0;
  local_78.basePipelineIndex = -1;
  local_78._92_4_ = 0;
  local_78.stage.sType = (local_e8._M_impl.super__Vector_impl_data._M_start)->sType;
  local_78.stage._4_4_ =
       *(undefined4 *)&(local_e8._M_impl.super__Vector_impl_data._M_start)->field_0x4;
  local_78.stage.pNext = (local_e8._M_impl.super__Vector_impl_data._M_start)->pNext;
  local_78.stage.flags = (local_e8._M_impl.super__Vector_impl_data._M_start)->flags;
  local_78.stage.stage = (local_e8._M_impl.super__Vector_impl_data._M_start)->stage;
  local_78.stage.module = (local_e8._M_impl.super__Vector_impl_data._M_start)->module;
  local_78.stage.pName = (local_e8._M_impl.super__Vector_impl_data._M_start)->pName;
  local_78.stage.pSpecializationInfo =
       (local_e8._M_impl.super__Vector_impl_data._M_start)->pSpecializationInfo;
  local_78.layout = (this->m_PipelineLayout).m_VkPipelineLayout.m_VkObject;
  VulkanUtilities::VulkanLogicalDevice::CreateComputePipeline
            (&local_90,
             (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_pDevice)->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&local_78,cache,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  operator=(&this->m_Pipeline,&local_90);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper(&local_90);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::~vector(&local_c8);
  std::
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~_Vector_base(&local_e8);
  return;
}

Assistant:

void PipelineStateVkImpl::InitializePipeline(const ComputePipelineStateCreateInfo& CreateInfo)
{
    std::vector<VkPipelineShaderStageCreateInfo>      vkShaderStages;
    std::vector<VulkanUtilities::ShaderModuleWrapper> ShaderModules;

    InitInternalObjects(CreateInfo, vkShaderStages, ShaderModules);

    const VkPipelineCache vkSPOCache = CreateInfo.pPSOCache != nullptr ? ClassPtrCast<PipelineStateCacheVkImpl>(CreateInfo.pPSOCache)->GetVkPipelineCache() : VK_NULL_HANDLE;
    CreateComputePipeline(m_pDevice, vkShaderStages, m_PipelineLayout, m_Desc, m_Pipeline, vkSPOCache);
}